

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

void getQR(double *A,int M,int N,double *bvec,double *Q,double *R)

{
  long lVar1;
  size_t __size;
  int iVar2;
  double *B;
  double *A_00;
  double *C;
  ulong uVar3;
  long lVar4;
  double *pdVar5;
  ulong uVar6;
  double *pdVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  double *pdVar15;
  int iVar16;
  long lVar17;
  
  lVar9 = (long)M;
  __size = lVar9 * 8;
  B = (double *)malloc(__size);
  lVar17 = (long)N;
  A_00 = (double *)malloc(__size * lVar17);
  C = (double *)malloc(__size * lVar9);
  uVar6 = 0;
  uVar3 = 0;
  if (0 < N) {
    uVar3 = (ulong)(uint)N;
  }
  pdVar7 = A;
  for (; uVar6 != uVar3; uVar6 = uVar6 + 1) {
    for (uVar12 = 0; (uint)N != uVar12; uVar12 = uVar12 + 1) {
      if (uVar12 < uVar6) {
        R[uVar12] = 0.0;
      }
      else {
        R[uVar12] = pdVar7[uVar12];
      }
    }
    R = R + lVar17;
    pdVar7 = pdVar7 + lVar17;
  }
  uVar6 = 0;
  uVar12 = 0;
  pdVar7 = Q;
  if (0 < M) {
    uVar12 = (ulong)(uint)M;
  }
  for (; uVar6 != uVar12; uVar6 = uVar6 + 1) {
    for (uVar14 = 0; uVar3 != uVar14; uVar14 = uVar14 + 1) {
      if (uVar6 == uVar14) {
        Q[uVar6 + uVar6 * lVar17] = 1.0;
      }
      else {
        pdVar7[uVar14] = 0.0;
      }
    }
    pdVar7 = pdVar7 + lVar17;
  }
  iVar16 = M - N;
  lVar10 = (long)(N + -1);
  lVar8 = lVar17 * 8 + 8;
  pdVar7 = (double *)((long)A + lVar8 * lVar17 + -8);
  uVar3 = lVar17 * 8 ^ 0xfffffffffffffff8;
  pdVar15 = (double *)((long)Q + lVar8 * lVar10);
  iVar13 = 1;
  lVar8 = lVar17;
  while (iVar16 = iVar16 + 1, 0 < lVar8) {
    lVar1 = lVar8 + -1;
    *B = 1.0;
    pdVar5 = pdVar7;
    for (lVar4 = 0; lVar8 + lVar4 < lVar9; lVar4 = lVar4 + 1) {
      B[lVar4 + 1] = *pdVar5;
      pdVar5 = pdVar5 + lVar17;
    }
    iVar2 = 0;
    pdVar5 = pdVar15;
    for (lVar8 = lVar10; lVar8 < lVar9; lVar8 = lVar8 + 1) {
      iVar11 = iVar2;
      for (lVar4 = 0; lVar10 + lVar4 < lVar17; lVar4 = lVar4 + 1) {
        A_00[iVar11] = pdVar5[lVar4];
        iVar11 = iVar11 + iVar16;
      }
      pdVar5 = pdVar5 + lVar17;
      iVar2 = iVar2 + 1;
    }
    iVar11 = M - (int)lVar1;
    iVar2 = N - (int)lVar1;
    mmult(A_00,B,C,iVar2,iVar11,1);
    scale(C,iVar2,1,bvec[lVar1]);
    mmult(B,C,A_00,iVar11,1,iVar2);
    iVar2 = 0;
    pdVar5 = pdVar15;
    for (lVar8 = lVar10; lVar8 < lVar9; lVar8 = lVar8 + 1) {
      for (lVar4 = 0; lVar10 + lVar4 < lVar17; lVar4 = lVar4 + 1) {
        pdVar5[lVar4] = pdVar5[lVar4] - A_00[iVar2 + (int)lVar4];
      }
      pdVar5 = pdVar5 + lVar17;
      iVar2 = iVar2 + iVar13;
    }
    lVar10 = lVar10 + -1;
    pdVar7 = (double *)((long)pdVar7 + uVar3);
    pdVar15 = (double *)((long)pdVar15 + uVar3);
    iVar13 = iVar13 + 1;
    lVar8 = lVar1;
  }
  free(B);
  free(A_00);
  free(C);
  return;
}

Assistant:

void getQR(double *A,int M,int N,double *bvec,double *Q, double *R) {
	int i,j,k,t,u;
	double *x,*v,*AT,*w;
	
	x = (double*) malloc(sizeof(double) * M);
	v = (double*) malloc(sizeof(double) * M);
	AT = (double*) malloc(sizeof(double) * M * N);
	w = (double*) malloc(sizeof(double) * M * M);
	
	for(i = 0; i < N;++i) {
		t = i *N;
		for(j = 0; j < N;++j) {
			if (i > j) {
				R[t+j] = 0.;
			} else {
				R[t+j] = A[t+j];
			}
		}
	}
	
	for(i = 0; i < M;++i) {
		t = i *N;
		for(j = 0; j < N;++j) {
			if (i == j) {
				Q[t+j] = 1.;
			} else {
				Q[t+j] = 0.;
			}
		}
	}
	
	for(j = N-1; j >= 0;--j) {
		v[0] = 1.;
		for(i=j+1;i < M;++i) {
			v[i-j] = A[i*N+j];
			
		}
		
		for (i=j; i < M; i++) {
			t = i * N;
			u = 0;
			for (k=j; k < N; k++) {
				AT[u+i-j] = Q[k+t];
				u+=(M-j);
			}
			
		}
	
		mmult(AT,v,w,N-j,M-j,1);
		scale(w,N-j,1,bvec[j]);
		mmult(v,w,AT,M-j,1,N-j);
		
		for (i=j; i < M; i++) {
			t = i *N;
			for (k=j; k < N; k++) {
				Q[t+k] -= AT[(i-j)*(N-j) + k - j];
			}
		}
	 
	}
	
	free(x);
	free(v);
	free(AT);
	free(w);
}